

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p224(mbedtls_mpi *N)

{
  char cVar1;
  uint local_88;
  undefined1 local_68 [8];
  mbedtls_mpi_uint Cp [4];
  mbedtls_mpi C;
  size_t bits;
  size_t i;
  char local_16;
  char local_15;
  uint32_t cur;
  char cc;
  char c;
  mbedtls_mpi *pmStack_10;
  int ret;
  mbedtls_mpi *N_local;
  
  cur = 0xffffff92;
  local_15 = '\0';
  Cp[3]._0_4_ = 1;
  pmStack_10 = N;
  memset(local_68,0,0x20);
  cur = mbedtls_mpi_grow(pmStack_10,7);
  if (cur == 0) {
    i._4_4_ = (uint)*pmStack_10->p;
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[3] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff00000000;
    *pmStack_10->p = (ulong)i._4_4_ | *pmStack_10->p;
    i._4_4_ = (uint)(*pmStack_10->p >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff;
    *pmStack_10->p = (ulong)i._4_4_ << 0x20 | *pmStack_10->p;
    i._4_4_ = (uint)pmStack_10->p[1];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff00000000;
    pmStack_10->p[1] = (ulong)i._4_4_ | pmStack_10->p[1];
    i._4_4_ = (uint)(pmStack_10->p[1] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[3] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff;
    pmStack_10->p[1] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[1];
    i._4_4_ = (uint)pmStack_10->p[2];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff00000000;
    pmStack_10->p[2] = (ulong)i._4_4_ | pmStack_10->p[2];
    i._4_4_ = (uint)(pmStack_10->p[2] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff;
    pmStack_10->p[2] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[2];
    i._4_4_ = (uint)pmStack_10->p[3];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff00000000;
    pmStack_10->p[3] = (ulong)i._4_4_ | pmStack_10->p[3];
    bits = 7;
    if (local_15 < '\x01') {
      local_88 = 0;
    }
    else {
      local_88 = (uint)local_15;
    }
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff;
    pmStack_10->p[3] = (ulong)local_88 << 0x20 | pmStack_10->p[3];
    i._4_4_ = 0;
    while (bits = bits + 1, bits < pmStack_10->n << 1) {
      if ((bits & 1) == 0) {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff00000000;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
      else {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
    }
    if (local_15 < '\0') {
      fix_negative(pmStack_10,local_15,(mbedtls_mpi *)(Cp + 3),0xe0);
    }
  }
  return cur;
}

Assistant:

static int ecp_mod_p224( mbedtls_mpi *N )
{
    INIT( 224 );

    SUB(  7 ); SUB( 11 );               NEXT; // A0 += -A7 - A11
    SUB(  8 ); SUB( 12 );               NEXT; // A1 += -A8 - A12
    SUB(  9 ); SUB( 13 );               NEXT; // A2 += -A9 - A13
    SUB( 10 ); ADD(  7 ); ADD( 11 );    NEXT; // A3 += -A10 + A7 + A11
    SUB( 11 ); ADD(  8 ); ADD( 12 );    NEXT; // A4 += -A11 + A8 + A12
    SUB( 12 ); ADD(  9 ); ADD( 13 );    NEXT; // A5 += -A12 + A9 + A13
    SUB( 13 ); ADD( 10 );               LAST; // A6 += -A13 + A10

cleanup:
    return( ret );
}